

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O2

node_t binop(int id,node_t left,node_t right)

{
  _node_t *to;
  
  to = create_node();
  to->id = id;
  to->type = (uint)(id == 0x3d) * 2 + BINOP;
  add_child(to,(_node_t *)left);
  add_child(to,(_node_t *)right);
  return to;
}

Assistant:

node_t binop(int id, node_t left, node_t right)
{
    _node_t* new = create_node();
    new->id = id;
    if (id == '=')
        new->type = ASSIGN;
    else
        new->type = BINOP;
    add_child(new, (_node_t*)left);
    add_child(new, (_node_t*)right);
    return (node_t)new;
}